

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O0

matd_t * homography_compute2(double (*c) [4])

{
  long lVar1;
  matd_t *pmVar2;
  double local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  undefined8 local_2c0;
  int local_2b4;
  double dStack_2b0;
  int i_2;
  double sum;
  int col_1;
  int j;
  double f;
  double dStack_290;
  int i_1;
  double tmp;
  double dStack_280;
  int i;
  double val;
  int row;
  int max_val_idx;
  double max_val;
  double dStack_260;
  int col;
  double epsilon;
  double A [72];
  double (*c_local) [4];
  
  epsilon = (*c)[0];
  A[0] = (*c)[1];
  A[1] = 1.0;
  A[2] = 0.0;
  A[3] = 0.0;
  A[4] = 0.0;
  A[5] = -(*c)[0] * (*c)[2];
  A[6] = -(*c)[1] * (*c)[2];
  A[7] = (*c)[2];
  A[8] = 0.0;
  A[9] = 0.0;
  A[10] = 0.0;
  A[0xb] = (*c)[0];
  A[0xc] = (*c)[1];
  A[0xd] = 1.0;
  A[0xe] = -(*c)[0] * (*c)[3];
  A[0xf] = -(*c)[1] * (*c)[3];
  A[0x10] = (*c)[3];
  A[0x11] = c[1][0];
  A[0x12] = c[1][1];
  A[0x13] = 1.0;
  A[0x14] = 0.0;
  A[0x15] = 0.0;
  A[0x16] = 0.0;
  A[0x17] = -c[1][0] * c[1][2];
  A[0x18] = -c[1][1] * c[1][2];
  A[0x19] = c[1][2];
  A[0x1a] = 0.0;
  A[0x1b] = 0.0;
  A[0x1c] = 0.0;
  A[0x1d] = c[1][0];
  A[0x1e] = c[1][1];
  A[0x1f] = 1.0;
  A[0x20] = -c[1][0] * c[1][3];
  A[0x21] = -c[1][1] * c[1][3];
  A[0x22] = c[1][3];
  A[0x23] = c[2][0];
  A[0x24] = c[2][1];
  A[0x25] = 1.0;
  A[0x26] = 0.0;
  A[0x27] = 0.0;
  A[0x28] = 0.0;
  A[0x29] = -c[2][0] * c[2][2];
  A[0x2a] = -c[2][1] * c[2][2];
  A[0x2b] = c[2][2];
  A[0x2c] = 0.0;
  A[0x2d] = 0.0;
  A[0x2e] = 0.0;
  A[0x2f] = c[2][0];
  A[0x30] = c[2][1];
  A[0x31] = 1.0;
  A[0x32] = -c[2][0] * c[2][3];
  A[0x33] = -c[2][1] * c[2][3];
  A[0x34] = c[2][3];
  A[0x35] = c[3][0];
  A[0x36] = c[3][1];
  A[0x37] = 1.0;
  A[0x38] = 0.0;
  A[0x39] = 0.0;
  A[0x3a] = 0.0;
  A[0x3b] = -c[3][0] * c[3][2];
  A[0x3c] = -c[3][1] * c[3][2];
  A[0x3d] = c[3][2];
  A[0x3e] = 0.0;
  A[0x3f] = 0.0;
  A[0x40] = 0.0;
  A[0x41] = c[3][0];
  A[0x42] = c[3][1];
  A[0x43] = 1.0;
  A[0x44] = -c[3][0] * c[3][3];
  A[0x45] = -c[3][1] * c[3][3];
  A[0x46] = c[3][3];
  dStack_260 = 1e-10;
  for (max_val._4_4_ = 0; max_val._4_4_ < 8; max_val._4_4_ = max_val._4_4_ + 1) {
    _row = 0.0;
    val._4_4_ = -1;
    for (val._0_4_ = max_val._4_4_; val._0_4_ < 8; val._0_4_ = val._0_4_ + 1) {
      dStack_280 = ABS(A[(long)(val._0_4_ * 9 + max_val._4_4_) + -1]);
      if (_row < dStack_280) {
        val._4_4_ = val._0_4_;
        _row = dStack_280;
      }
    }
    if (_row < dStack_260) {
      fprintf(_stderr,"WRN: Matrix is singular.\n");
    }
    f._4_4_ = max_val._4_4_;
    if (val._4_4_ != max_val._4_4_) {
      for (tmp._4_4_ = max_val._4_4_; tmp._4_4_ < 9; tmp._4_4_ = tmp._4_4_ + 1) {
        dStack_290 = A[(long)(max_val._4_4_ * 9 + tmp._4_4_) + -1];
        A[(long)(max_val._4_4_ * 9 + tmp._4_4_) + -1] = A[(long)(val._4_4_ * 9 + tmp._4_4_) + -1];
        A[(long)(val._4_4_ * 9 + tmp._4_4_) + -1] = dStack_290;
      }
    }
    while (f._4_4_ = f._4_4_ + 1, f._4_4_ < 8) {
      _col_1 = A[(long)(f._4_4_ * 9 + max_val._4_4_) + -1] / A[(long)(max_val._4_4_ * 10) + -1];
      A[(long)(f._4_4_ * 9 + max_val._4_4_) + -1] = 0.0;
      sum._4_4_ = max_val._4_4_;
      while (sum._4_4_ = sum._4_4_ + 1, sum._4_4_ < 9) {
        lVar1 = (long)(f._4_4_ * 9 + sum._4_4_);
        A[lVar1 + -1] = -_col_1 * A[(long)(max_val._4_4_ * 9 + sum._4_4_) + -1] + A[lVar1 + -1];
      }
    }
  }
  for (sum._0_4_ = 7; -1 < sum._0_4_; sum._0_4_ = sum._0_4_ + -1) {
    dStack_2b0 = 0.0;
    local_2b4 = sum._0_4_;
    while (local_2b4 = local_2b4 + 1, local_2b4 < 8) {
      dStack_2b0 = A[(long)(sum._0_4_ * 9 + local_2b4) + -1] * A[(long)(local_2b4 * 9 + 8) + -1] +
                   dStack_2b0;
    }
    A[(long)(sum._0_4_ * 9 + 8) + -1] =
         (A[(long)(sum._0_4_ * 9 + 8) + -1] - dStack_2b0) / A[(long)(sum._0_4_ * 10) + -1];
  }
  local_300 = A[7];
  local_2f8 = A[0x10];
  local_2f0 = A[0x19];
  local_2e8 = A[0x22];
  local_2e0 = A[0x2b];
  local_2d8 = A[0x34];
  local_2d0 = A[0x3d];
  local_2c8 = A[0x46];
  local_2c0 = 0x3ff0000000000000;
  pmVar2 = matd_create_data(3,3,&local_300);
  return pmVar2;
}

Assistant:

matd_t* homography_compute2(double c[4][4]) {
    double A[] =  {
            c[0][0], c[0][1], 1,       0,       0, 0, -c[0][0]*c[0][2], -c[0][1]*c[0][2], c[0][2],
                  0,       0, 0, c[0][0], c[0][1], 1, -c[0][0]*c[0][3], -c[0][1]*c[0][3], c[0][3],
            c[1][0], c[1][1], 1,       0,       0, 0, -c[1][0]*c[1][2], -c[1][1]*c[1][2], c[1][2],
                  0,       0, 0, c[1][0], c[1][1], 1, -c[1][0]*c[1][3], -c[1][1]*c[1][3], c[1][3],
            c[2][0], c[2][1], 1,       0,       0, 0, -c[2][0]*c[2][2], -c[2][1]*c[2][2], c[2][2],
                  0,       0, 0, c[2][0], c[2][1], 1, -c[2][0]*c[2][3], -c[2][1]*c[2][3], c[2][3],
            c[3][0], c[3][1], 1,       0,       0, 0, -c[3][0]*c[3][2], -c[3][1]*c[3][2], c[3][2],
                  0,       0, 0, c[3][0], c[3][1], 1, -c[3][0]*c[3][3], -c[3][1]*c[3][3], c[3][3],
    };

    double epsilon = 1e-10;

    // Eliminate.
    for (int col = 0; col < 8; col++) {
        // Find best row to swap with.
        double max_val = 0;
        int max_val_idx = -1;
        for (int row = col; row < 8; row++) {
            double val = fabs(A[row*9 + col]);
            if (val > max_val) {
                max_val = val;
                max_val_idx = row;
            }
        }

        if (max_val < epsilon) {
            fprintf(stderr, "WRN: Matrix is singular.\n");
        }

        // Swap to get best row.
        if (max_val_idx != col) {
            for (int i = col; i < 9; i++) {
                double tmp = A[col*9 + i];
                A[col*9 + i] = A[max_val_idx*9 + i];
                A[max_val_idx*9 + i] = tmp;
            }
        }

        // Do eliminate.
        for (int i = col + 1; i < 8; i++) {
            double f = A[i*9 + col]/A[col*9 + col];
            A[i*9 + col] = 0;
            for (int j = col + 1; j < 9; j++) {
                A[i*9 + j] -= f*A[col*9 + j];
            }
        }
    }

    // Back solve.
    for (int col = 7; col >=0; col--) {
        double sum = 0;
        for (int i = col + 1; i < 8; i++) {
            sum += A[col*9 + i]*A[i*9 + 8];
        }
        A[col*9 + 8] = (A[col*9 + 8] - sum)/A[col*9 + col];
    }
    return matd_create_data(3, 3, (double[]) { A[8], A[17], A[26], A[35], A[44], A[53], A[62], A[71], 1 });
}